

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_blanket(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  short sVar2;
  CHAR_DATA *in_RDX;
  undefined2 in_SI;
  int in_EDI;
  ROOM_AFFECT_DATA raf;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff28;
  CHAR_DATA *ch_00;
  ushort in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3a;
  undefined2 uVar3;
  undefined2 in_stack_ffffffffffffff3c;
  short sVar4;
  undefined2 in_stack_ffffffffffffff3e;
  undefined2 in_stack_ffffffffffffff40;
  undefined2 uVar5;
  undefined2 in_stack_ffffffffffffff42;
  undefined2 uVar6;
  undefined2 in_stack_ffffffffffffff44;
  undefined2 in_stack_ffffffffffffff46;
  
  bVar1 = is_affected(in_RDX,in_EDI);
  if (bVar1) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffff46,
                                  CONCAT24(in_stack_ffffffffffffff44,
                                           CONCAT22(in_stack_ffffffffffffff42,
                                                    in_stack_ffffffffffffff40))),
                 (CHAR_DATA *)
                 CONCAT26(in_stack_ffffffffffffff3e,
                          CONCAT24(in_stack_ffffffffffffff3c,
                                   CONCAT22(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38))));
  }
  else if ((in_RDX->in_room->sector_type == 0) ||
          ((((in_RDX->in_room->sector_type != 9 && (in_RDX->in_room->sector_type != 6)) &&
            (in_RDX->in_room->sector_type != 8)) && (in_RDX->in_room->sector_type != 0x11)))) {
    if ((in_RDX->in_room->sector_type == 0) ||
       ((in_RDX->in_room->sector_type != 0xd && (in_RDX->in_room->sector_type != 10)))) {
      bVar1 = is_outside((CHAR_DATA *)
                         CONCAT26(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,
                                           CONCAT22(in_stack_ffffffffffffff3a,
                                                    in_stack_ffffffffffffff38))));
      if (bVar1) {
        if (in_RDX->in_room->area->temp == 0) {
          send_to_char((char *)CONCAT26(in_stack_ffffffffffffff46,
                                        CONCAT24(in_stack_ffffffffffffff44,
                                                 CONCAT22(in_stack_ffffffffffffff42,
                                                          in_stack_ffffffffffffff40))),
                       (CHAR_DATA *)
                       CONCAT26(in_stack_ffffffffffffff3e,
                                CONCAT24(in_stack_ffffffffffffff3c,
                                         CONCAT22(in_stack_ffffffffffffff3a,
                                                  in_stack_ffffffffffffff38))));
        }
        else {
          init_affect_room((ROOM_AFFECT_DATA *)0x6e36e4);
          uVar3 = 0;
          uVar5 = 0x18;
          uVar6 = 3;
          sVar2 = 0x13 - in_RDX->in_room->sector_type;
          ch_00 = in_RDX;
          sVar4 = gsn_blanket;
          new_affect_to_room((ROOM_INDEX_DATA *)
                             CONCAT26(in_stack_ffffffffffffff46,CONCAT24(sVar2,0x30018)),
                             (ROOM_AFFECT_DATA *)
                             CONCAT26(in_SI,CONCAT24(gsn_blanket,(uint)in_stack_ffffffffffffff38)));
          init_affect((AFFECT_DATA *)0x6e3781);
          affect_to_char(ch_00,in_stack_ffffffffffffff28);
          clear_tracks(in_RDX->in_room);
          act((char *)CONCAT26(in_stack_ffffffffffffff46,CONCAT24(sVar2,CONCAT22(uVar6,uVar5))),
              (CHAR_DATA *)CONCAT26(in_SI,CONCAT24(sVar4,CONCAT22(uVar3,in_stack_ffffffffffffff38)))
              ,ch_00,in_stack_ffffffffffffff28,0);
        }
      }
      else {
        send_to_char((char *)CONCAT26(in_stack_ffffffffffffff46,
                                      CONCAT24(in_stack_ffffffffffffff44,
                                               CONCAT22(in_stack_ffffffffffffff42,
                                                        in_stack_ffffffffffffff40))),
                     (CHAR_DATA *)
                     CONCAT26(in_stack_ffffffffffffff3e,
                              CONCAT24(in_stack_ffffffffffffff3c,
                                       CONCAT22(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38)
                                      )));
      }
    }
    else {
      send_to_char((char *)CONCAT26(in_stack_ffffffffffffff46,
                                    CONCAT24(in_stack_ffffffffffffff44,
                                             CONCAT22(in_stack_ffffffffffffff42,
                                                      in_stack_ffffffffffffff40))),
                   (CHAR_DATA *)
                   CONCAT26(in_stack_ffffffffffffff3e,
                            CONCAT24(in_stack_ffffffffffffff3c,
                                     CONCAT22(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38)))
                  );
    }
  }
  else {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffff46,
                                  CONCAT24(in_stack_ffffffffffffff44,
                                           CONCAT22(in_stack_ffffffffffffff42,
                                                    in_stack_ffffffffffffff40))),
                 (CHAR_DATA *)
                 CONCAT26(in_stack_ffffffffffffff3e,
                          CONCAT24(in_stack_ffffffffffffff3c,
                                   CONCAT22(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38))));
  }
  return;
}

Assistant:

void spell_blanket(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	ROOM_AFFECT_DATA raf;

	if (is_affected(ch, sn))
	{
		send_to_char("You have not yet fully recovered from your last casting.\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type
		&& (ch->in_room->sector_type == SECT_AIR
			|| ch->in_room->sector_type == SECT_WATER
			|| ch->in_room->sector_type == SECT_UNDERWATER
			|| ch->in_room->sector_type == SECT_VERTICAL))
	{
		send_to_char("Blanket what??\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type
		&& (ch->in_room->sector_type == SECT_BURNING
			|| ch->in_room->sector_type == SECT_DESERT))
	{		
		send_to_char("Your magic is not powerful enough to create snow here.\n\r", ch);
		return;
	}

	if (!is_outside(ch))
	{
		send_to_char("No amount of concentration will make it snow indoors.\n\r", ch);
		return;
	}

	if (ch->in_room->area->temp == Temperature::Hot)
	{
		send_to_char("It is too hot to create even magical snow right now.\n\r", ch);
		return;
	}

	init_affect_room(&raf);
	raf.where = TO_ROOM_AFFECTS;
	raf.type = gsn_blanket;
	raf.aftype = AFT_SPELL;
	raf.level = level;
	raf.duration = 24;
	raf.location = APPLY_ROOM_SECT;
	raf.modifier = SECT_SNOW - ch->in_room->sector_type;
	raf.owner = ch;
	raf.end_fun = blanket_melt;
	raf.tick_fun = nullptr;
	new_affect_to_room(ch->in_room, &raf);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_blanket;
	af.aftype = AFT_TIMER;
	af.level = level;
	af.duration = 24;
	af.location = 0;
	af.modifier = 0;
	affect_to_char(ch, &af);

	clear_tracks(ch->in_room);

	act("A sudden gust sweeps through, bearing heavy snowflakes that rapidly blanket the ground.", ch, 0, 0, TO_ALL);
}